

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void key_callback(GLFWwindow *window,wchar_t key,wchar_t scancode,wchar_t action,wchar_t mods)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  double dVar9;
  
  pvVar3 = glfwGetWindowUserPointer(window);
  pcVar4 = glfwGetKeyName(key,scancode);
  uVar2 = counter;
  counter = counter + 1;
  uVar1 = *(uint *)((long)pvVar3 + 8);
  dVar9 = glfwGetTime();
  pcVar5 = get_key_name(key);
  pcVar6 = get_mods_name(mods);
  if (pcVar4 == (char *)0x0) {
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",dVar9,
           (ulong)uVar2,(ulong)uVar1,(ulong)(uint)key,(ulong)(uint)scancode,pcVar5,pcVar6);
  }
  else {
    if ((uint)action < 3) {
      pcVar7 = (&PTR_anon_var_dwarf_390_0012ecc0)[(uint)action];
    }
    else {
      pcVar7 = "caused unknown action";
    }
    printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",dVar9,
           (ulong)uVar2,(ulong)uVar1,(ulong)(uint)key,(ulong)(uint)scancode,pcVar5,pcVar4,pcVar6,
           pcVar7);
  }
  if (key == L'C' && action == L'\x01') {
    bVar8 = *(int *)((long)pvVar3 + 0xc) == 0;
    *(uint *)((long)pvVar3 + 0xc) = (uint)bVar8;
    pcVar4 = "disabled";
    if (bVar8) {
      pcVar4 = "enabled";
    }
    printf("(( closing %s ))\n",pcVar4);
    return;
  }
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    Slot* slot = glfwGetWindowUserPointer(window);
    const char* name = glfwGetKeyName(key, scancode);

    if (name)
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               name,
               get_mods_name(mods),
               get_action_name(action));
    }
    else
    {
        printf("%08x to %i at %0.3f: Key 0x%04x Scancode 0x%04x (%s) (with%s) was %s\n",
               counter++, slot->number, glfwGetTime(), key, scancode,
               get_key_name(key),
               get_mods_name(mods),
               get_action_name(action));
    }

    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_C:
        {
            slot->closeable = !slot->closeable;

            printf("(( closing %s ))\n", slot->closeable ? "enabled" : "disabled");
            break;
        }
    }
}